

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void cxxopts::values::parse_value<int>(string *text,int *value)

{
  long *plVar1;
  argument_incorrect_type *this;
  istringstream is;
  istringstream aiStack_198 [16];
  long local_188;
  long local_178;
  long local_170;
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream(aiStack_198,(string *)text,_S_in);
  plVar1 = (long *)std::istream::operator>>(aiStack_198,value);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    local_170 = local_170 - local_178;
    if (local_170 == 0) {
      local_170 = (**(code **)(local_188 + 0x38))();
    }
    if (local_170 == 0) {
      std::__cxx11::istringstream::~istringstream(aiStack_198);
      std::ios_base::~ios_base(local_120);
      return;
    }
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  else {
    this = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(this,text);
  }
  __cxa_throw(this,&argument_incorrect_type::typeinfo,OptionException::~OptionException);
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }